

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

ProValueMap * __thiscall
QMakeEvaluator::findValues(QMakeEvaluator *this,ProKey *variableName,Iterator *rit)

{
  bool bVar1;
  const_iterator o;
  undefined8 *in_RDX;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  bool first;
  Iterator it;
  iterator vmi;
  iterator *in_stack_ffffffffffffff88;
  QList<ProString> *in_stack_ffffffffffffff90;
  ProKey *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  byte bVar2;
  reference local_38;
  _Self local_30;
  const_iterator local_28;
  iterator local_20;
  iterator local_18;
  _List_iterator<QMap<ProKey,_ProStringList>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_10._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::end
                 ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   *)in_stack_ffffffffffffff90);
  bVar2 = 1;
  while( true ) {
    std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator--(&local_10);
    local_18._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator*
              ((_List_iterator<QMap<ProKey,_ProStringList>_> *)0x2feb31);
    local_18._M_node =
         (_Base_ptr)
         QMap<ProKey,_ProStringList>::find
                   ((QMap<ProKey,_ProStringList> *)CONCAT17(bVar2,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
    std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator*
              ((_List_iterator<QMap<ProKey,_ProStringList>_> *)0x2feb4d);
    local_20._M_node =
         (_Base_ptr)
         QMap<ProKey,_ProStringList>::end((QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffffa0);
    bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) break;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::begin
                   ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                     *)in_stack_ffffffffffffff90);
    bVar1 = std::operator==(&local_10,&local_30);
    if ((bVar1) || (((bVar2 & 1) != 0 && (bVar1 = isFunctParam(in_RDI), bVar1)))) goto LAB_002fec25;
    bVar2 = 0;
  }
  QMap<ProKey,_ProStringList>::iterator::operator->((iterator *)0x2feb79);
  local_28 = QList<ProString>::constBegin(in_stack_ffffffffffffff90);
  o = QList<ProString>::constBegin(in_stack_ffffffffffffff90);
  bVar1 = QList<ProString>::const_iterator::operator==(&local_28,o);
  if (bVar1) {
LAB_002fec25:
    local_38 = (reference)0x0;
  }
  else {
    *in_RDX = local_18._M_node;
    local_38 = std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator*
                         ((_List_iterator<QMap<ProKey,_ProStringList>_> *)0x2febcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

ProValueMap *QMakeEvaluator::findValues(const ProKey &variableName, ProValueMap::Iterator *rit)
{
    ProValueMapStack::iterator vmi = m_valuemapStack.end();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::Iterator it = (*vmi).find(variableName);
        if (it != (*vmi).end()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            *rit = it;
            return &(*vmi);
        }
        if (vmi == m_valuemapStack.begin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return nullptr;
}